

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_defined_units.cpp
# Opt level: O0

void __thiscall
unitNameDefinitions_siDuplicates_Test::~unitNameDefinitions_siDuplicates_Test
          (unitNameDefinitions_siDuplicates_Test *this)

{
  unitNameDefinitions_siDuplicates_Test *this_local;
  
  ~unitNameDefinitions_siDuplicates_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitNameDefinitions, siDuplicates)
{
    std::unordered_map<units::unit, std::string> testMap;
    for (const auto& ustring : units::defined_unit_names_si) {
        if (ustring.second == nullptr) {
            continue;
        }
        auto res = testMap.emplace(ustring.first, ustring.second);
        EXPECT_TRUE(res.second) << "duplicate si unit string " << ustring.second
                                << " matching with " << res.first->second;
    }
}